

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleTextureNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  bool bVar1;
  Property *pPVar2;
  char *pcVar3;
  undefined1 local_46c [8];
  aiString tex;
  Value *val;
  allocator local_49;
  string local_48;
  Property *local_28;
  Property *prop;
  aiScene *param_2_local;
  DDLNode *node_local;
  OpenGEXImporter *this_local;
  
  if (node != (DDLNode *)0x0) {
    prop = (Property *)param_2;
    param_2_local = (aiScene *)node;
    node_local = (DDLNode *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,"attrib",&local_49);
    pPVar2 = ODDLParser::DDLNode::findPropertyByName(node,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    if (((pPVar2 != (Property *)0x0) && (pPVar2->m_value != (Value *)0x0)) &&
       (local_28 = pPVar2,
       tex.data._1016_8_ = ODDLParser::DDLNode::getValue((DDLNode *)param_2_local),
       (Value *)tex.data._1016_8_ != (Value *)0x0)) {
      aiString::aiString((aiString *)local_46c);
      pcVar3 = ODDLParser::Value::getString((Value *)tex.data._1016_8_);
      aiString::Set((aiString *)local_46c,pcVar3);
      pcVar3 = ODDLParser::Value::getString(local_28->m_value);
      bVar1 = std::operator==(pcVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)Grammar::DiffuseTextureToken_abi_cxx11_);
      if (bVar1) {
        aiMaterial::AddProperty(this->m_currentMaterial,(aiString *)local_46c,"$tex.file",1,0);
      }
      else {
        pcVar3 = ODDLParser::Value::getString(local_28->m_value);
        bVar1 = std::operator==(pcVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)Grammar::SpecularPowerTextureToken_abi_cxx11_);
        if (bVar1) {
          aiMaterial::AddProperty(this->m_currentMaterial,(aiString *)local_46c,"$tex.file",2,0);
        }
        else {
          pcVar3 = ODDLParser::Value::getString(local_28->m_value);
          bVar1 = std::operator==(pcVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)Grammar::EmissionTextureToken_abi_cxx11_);
          if (bVar1) {
            aiMaterial::AddProperty(this->m_currentMaterial,(aiString *)local_46c,"$tex.file",4,0);
          }
          else {
            pcVar3 = ODDLParser::Value::getString(local_28->m_value);
            bVar1 = std::operator==(pcVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)Grammar::OpacyTextureToken_abi_cxx11_);
            if (bVar1) {
              aiMaterial::AddProperty(this->m_currentMaterial,(aiString *)local_46c,"$tex.file",8,0)
              ;
            }
            else {
              pcVar3 = ODDLParser::Value::getString(local_28->m_value);
              bVar1 = std::operator==(pcVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)Grammar::TransparencyTextureToken_abi_cxx11_);
              if (!bVar1) {
                pcVar3 = ODDLParser::Value::getString(local_28->m_value);
                bVar1 = std::operator==(pcVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)Grammar::NormalTextureToken_abi_cxx11_);
                if (!bVar1) {
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                                ,0x447,
                                "void Assimp::OpenGEX::OpenGEXImporter::handleTextureNode(ODDLParser::DDLNode *, aiScene *)"
                               );
                }
                aiMaterial::AddProperty
                          (this->m_currentMaterial,(aiString *)local_46c,"$tex.file",6,0);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void OpenGEXImporter::handleTextureNode( ODDLParser::DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == node ) {
        return;
    }

    Property *prop = node->findPropertyByName( "attrib" );
    if( nullptr != prop ) {
        if( nullptr != prop->m_value ) {
            Value *val( node->getValue() );
            if( nullptr != val ) {
                aiString tex;
                tex.Set( val->getString() );
                if( prop->m_value->getString() == Grammar::DiffuseTextureToken ) {
                    m_currentMaterial->AddProperty( &tex, AI_MATKEY_TEXTURE_DIFFUSE( 0 ) );
                } else if( prop->m_value->getString() == Grammar::SpecularPowerTextureToken ) {
                    m_currentMaterial->AddProperty( &tex, AI_MATKEY_TEXTURE_SPECULAR( 0 ) );
                } else if( prop->m_value->getString() == Grammar::EmissionTextureToken ) {
                    m_currentMaterial->AddProperty( &tex, AI_MATKEY_TEXTURE_EMISSIVE( 0 ) );
                } else if( prop->m_value->getString() == Grammar::OpacyTextureToken ) {
                    m_currentMaterial->AddProperty( &tex, AI_MATKEY_TEXTURE_OPACITY( 0 ) );
                } else if( prop->m_value->getString() == Grammar::TransparencyTextureToken ) {
                    // ToDo!
                    // m_currentMaterial->AddProperty( &tex, AI_MATKEY_TEXTURE_DIFFUSE( 0 ) );
                } else if( prop->m_value->getString() == Grammar::NormalTextureToken ) {
                    m_currentMaterial->AddProperty( &tex, AI_MATKEY_TEXTURE_NORMALS( 0 ) );
                } else {
                    ai_assert( false );
                }
            }
        }
    }
}